

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall Game::PlaceFood(Game *this)

{
  bool bVar1;
  result_type x;
  result_type y;
  int iVar2;
  
  do {
    x = std::uniform_int_distribution<int>::operator()
                  (&this->random_w,&this->engine,&(this->random_w)._M_param);
    y = std::uniform_int_distribution<int>::operator()
                  (&this->random_h,&this->engine,&(this->random_h)._M_param);
    bVar1 = Snake::SnakeCell(&this->snake,x,y);
  } while (bVar1);
  iVar2 = 4;
  if (food_counter == 0 || (food_counter & 3U) != 0) {
    iVar2 = 1;
    if (food_counter != 0) {
      iVar2 = (uint)(food_counter * 0x38e38e39 + 0xe38e38eU < 0x1c71c71d) * 8 + 1;
    }
  }
  this->points = iVar2;
  (this->food).x = x;
  (this->food).y = y;
  return;
}

Assistant:

void Game::PlaceFood() {
  int x, y;
  while (true) {
    x = random_w(engine);
    y = random_h(engine);
    // Check that the location is not occupied by a snake item before placing
    // food.
    if (!snake.SnakeCell(x, y)) {
      if(Game::food_counter != 0 && Game::food_counter%4 == 0)
      {
        points = 4;
      }
      else if(Game::food_counter != 0 && Game::food_counter%9 == 0)
      {
        points = 9;
      }
      else
      {
        points = 1;
      }

      food.x = x;
      food.y = y;
      return;
    }
  }
}